

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void reuse_conn(Curl_easy *data,connectdata *old_conn,connectdata *conn)

{
  int local_5c;
  char local_58 [4];
  int local_port;
  char local_ip [46];
  connectdata *conn_local;
  connectdata *old_conn_local;
  Curl_easy *data_local;
  
  memset(local_58,0,0x2e);
  local_5c = -1;
  if (old_conn->user != (char *)0x0) {
    (*Curl_cfree)(conn->user);
    conn->user = (char *)0x0;
    (*Curl_cfree)(conn->passwd);
    conn->passwd = (char *)0x0;
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = (char *)0x0;
    old_conn->passwd = (char *)0x0;
  }
  *(uint *)&(conn->bits).field_0x4 =
       *(uint *)&(conn->bits).field_0x4 & 0xfffffffb |
       (*(uint *)&(old_conn->bits).field_0x4 >> 2 & 1) << 2;
  if ((*(uint *)&(conn->bits).field_0x4 >> 2 & 1) != 0) {
    (*Curl_cfree)((conn->http_proxy).user);
    (conn->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).user);
    (conn->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).passwd);
    (conn->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).passwd);
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (old_conn->http_proxy).user;
    (conn->socks_proxy).user = (old_conn->socks_proxy).user;
    (conn->http_proxy).passwd = (old_conn->http_proxy).passwd;
    (conn->socks_proxy).passwd = (old_conn->socks_proxy).passwd;
    (old_conn->http_proxy).user = (char *)0x0;
    (old_conn->socks_proxy).user = (char *)0x0;
    (old_conn->http_proxy).passwd = (char *)0x0;
    (old_conn->socks_proxy).passwd = (char *)0x0;
  }
  Curl_free_idnconverted_hostname(&conn->host);
  Curl_free_idnconverted_hostname(&conn->conn_to_host);
  (*Curl_cfree)((conn->host).rawalloc);
  (conn->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->conn_to_host).rawalloc);
  (conn->conn_to_host).rawalloc = (char *)0x0;
  (conn->host).rawalloc = (old_conn->host).rawalloc;
  (conn->host).encalloc = (old_conn->host).encalloc;
  (conn->host).name = (old_conn->host).name;
  (conn->host).dispname = (old_conn->host).dispname;
  (old_conn->host).rawalloc = (char *)0x0;
  (old_conn->host).encalloc = (char *)0x0;
  (conn->conn_to_host).rawalloc = (old_conn->conn_to_host).rawalloc;
  (conn->conn_to_host).encalloc = (old_conn->conn_to_host).encalloc;
  (conn->conn_to_host).name = (old_conn->conn_to_host).name;
  (conn->conn_to_host).dispname = (old_conn->conn_to_host).dispname;
  (old_conn->conn_to_host).rawalloc = (char *)0x0;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  (*Curl_cfree)(conn->hostname_resolve);
  conn->hostname_resolve = (char *)0x0;
  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = (char *)0x0;
  if (conn->transport == '\x03') {
    Curl_conninfo_local(data,conn->sock[0],local_58,&local_5c);
  }
  Curl_persistconninfo(data,conn,local_58,local_5c);
  *(uint *)&(conn->bits).field_0x4 = *(uint *)&(conn->bits).field_0x4 & 0xffffff7f | 0x80;
  conn_free(old_conn);
  return;
}

Assistant:

static void reuse_conn(struct Curl_easy *data,
                       struct connectdata *old_conn,
                       struct connectdata *conn)
{
  /* 'local_ip' and 'local_port' get filled with local's numerical
     ip address and port number whenever an outgoing connection is
     **established** from the primary socket to a remote address. */
  char local_ip[MAX_IPADR_LEN] = "";
  int local_port = -1;

  /* get the user+password information from the old_conn struct since it may
   * be new for this request even when we re-use an existing connection */
  if(old_conn->user) {
    /* use the new user name and password though */
    Curl_safefree(conn->user);
    Curl_safefree(conn->passwd);
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = NULL;
    old_conn->passwd = NULL;
  }

#ifndef CURL_DISABLE_PROXY
  conn->bits.proxy_user_passwd = old_conn->bits.proxy_user_passwd;
  if(conn->bits.proxy_user_passwd) {
    /* use the new proxy user name and proxy password though */
    Curl_safefree(conn->http_proxy.user);
    Curl_safefree(conn->socks_proxy.user);
    Curl_safefree(conn->http_proxy.passwd);
    Curl_safefree(conn->socks_proxy.passwd);
    conn->http_proxy.user = old_conn->http_proxy.user;
    conn->socks_proxy.user = old_conn->socks_proxy.user;
    conn->http_proxy.passwd = old_conn->http_proxy.passwd;
    conn->socks_proxy.passwd = old_conn->socks_proxy.passwd;
    old_conn->http_proxy.user = NULL;
    old_conn->socks_proxy.user = NULL;
    old_conn->http_proxy.passwd = NULL;
    old_conn->socks_proxy.passwd = NULL;
  }
#endif

  Curl_free_idnconverted_hostname(&conn->host);
  Curl_free_idnconverted_hostname(&conn->conn_to_host);
  Curl_safefree(conn->host.rawalloc);
  Curl_safefree(conn->conn_to_host.rawalloc);
  conn->host = old_conn->host;
  old_conn->host.rawalloc = NULL;
  old_conn->host.encalloc = NULL;
  conn->conn_to_host = old_conn->conn_to_host;
  old_conn->conn_to_host.rawalloc = NULL;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  Curl_safefree(conn->hostname_resolve);

  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = NULL;

  /* persist connection info in session handle */
  if(conn->transport == TRNSPRT_TCP) {
    Curl_conninfo_local(data, conn->sock[FIRSTSOCKET],
                        local_ip, &local_port);
  }
  Curl_persistconninfo(data, conn, local_ip, local_port);

  conn_reset_all_postponed_data(old_conn); /* free buffers */

  /* re-use init */
  conn->bits.reuse = TRUE; /* yes, we're re-using here */

  conn_free(old_conn);
}